

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::UnaryAggregateHeap<double,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<double,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          double *value)

{
  idx_t iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  HeapEntry<double> *pHVar8;
  HeapEntry<double> local_50;
  ulong local_48;
  double local_40;
  double *local_38;
  
  pHVar8 = this->heap;
  uVar5 = this->size;
  if (uVar5 < this->capacity) {
    this->size = uVar5 + 1;
    pHVar8[uVar5].value = *value;
    local_50.value = pHVar8[uVar5].value;
    if (1 < (long)(uVar5 + 1)) {
      do {
        uVar6 = (long)((uVar5 - ((long)(uVar5 - 1) >> 0x3f)) + -1) >> 1;
        bVar2 = GreaterThan::Operation<double>(&pHVar8[uVar6].value,&local_50.value);
        if (!bVar2) break;
        pHVar8[uVar5].value = pHVar8[uVar6].value;
        bVar2 = 2 < (long)uVar5;
        uVar5 = uVar6;
      } while (bVar2);
    }
  }
  else {
    bVar2 = GreaterThan::Operation<double>(value,&pHVar8->value);
    if (!bVar2) {
      return;
    }
    iVar1 = this->size;
    if (1 < (long)iVar1) {
      pHVar8 = this->heap;
      local_40 = pHVar8[iVar1 - 1].value;
      pHVar8[iVar1 - 1].value = pHVar8->value;
      local_48 = iVar1 * 8 - 8;
      lVar7 = (long)local_48 >> 3;
      local_38 = value;
      if (lVar7 < 3) {
        lVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          bVar2 = GreaterThan::Operation<double>
                            (&pHVar8[lVar4 * 2 + 2].value,&pHVar8[lVar4 * 2 + 1].value);
          if (bVar2) {
            lVar3 = lVar4 * 2 + 1;
          }
          else {
            lVar3 = lVar4 * 2 + 2;
          }
          pHVar8[lVar4].value = pHVar8[lVar3].value;
          lVar4 = lVar3;
        } while (lVar3 < (lVar7 - (lVar7 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((local_48 & 8) == 0) && (lVar3 == lVar7 + -2 >> 1)) {
        pHVar8[lVar3].value = pHVar8[lVar3 * 2 + 1].value;
        lVar3 = lVar3 * 2 + 1;
      }
      local_50.value = local_40;
      if (0 < lVar3) {
        do {
          lVar7 = (lVar3 - (lVar3 + -1 >> 0x3f)) + -1 >> 1;
          bVar2 = GreaterThan::Operation<double>(&pHVar8[lVar7].value,&local_50.value);
          if (!bVar2) break;
          pHVar8[lVar3].value = pHVar8[lVar7].value;
          bVar2 = 2 < lVar3;
          lVar3 = lVar7;
        } while (bVar2);
      }
      pHVar8[lVar3].value = local_50.value;
      value = local_38;
    }
    pHVar8 = this->heap;
    iVar1 = this->size;
    local_50.value = *value;
    pHVar8[iVar1 - 1].value = local_50.value;
    lVar7 = (long)(iVar1 << 3) >> 3;
    uVar5 = lVar7 - 1;
    if (1 < lVar7) {
      do {
        uVar6 = (long)((uVar5 - ((long)(uVar5 - 1) >> 0x3f)) + -1) >> 1;
        bVar2 = GreaterThan::Operation<double>(&pHVar8[uVar6].value,&local_50.value);
        if (!bVar2) break;
        pHVar8[uVar5].value = pHVar8[uVar6].value;
        bVar2 = 2 < (long)uVar5;
        uVar5 = uVar6;
      } while (bVar2);
    }
  }
  pHVar8[uVar5].value = local_50.value;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}